

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

TestStatus *
vkt::tessellation::anon_unknown_0::TessCoordComponent::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition caseDef)

{
  pointer *ppVVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  undefined8 *puVar3;
  int *piVar4;
  TestLog *pTVar5;
  undefined8 uVar6;
  Allocation *pAVar7;
  TestStatus *pTVar8;
  VkDeviceSize commandBuffer;
  char cVar9;
  deUint32 queueFamilyIndex;
  int iVar10;
  deUint32 stride;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkDevice device;
  Allocator *allocator;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this;
  DescriptorPoolBuilder *this_00;
  DescriptorSetUpdateBuilder *this_01;
  GraphicsPipelineBuilder *pGVar11;
  const_iterator cVar12;
  TessPrimitiveType primitiveType;
  code *pcVar13;
  int iVar14;
  DeviceInterface *vk;
  pointer vec;
  VkDeviceSize bufferSize;
  long lVar15;
  float fVar16;
  key_type local_588;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  VkDeviceSize local_528;
  pointer pWStack_520;
  pointer local_518;
  VkAllocationCallbacks *pVStack_510;
  pointer local_508;
  pointer local_500;
  VkAllocationCallbacks *local_4f8;
  DeviceInterface *local_4f0;
  VkRenderPass local_4e8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_4e0;
  key_type local_4c8;
  Buffer local_4a8;
  VkPipelineLayout local_478;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_470;
  VkDescriptorSetLayout local_458;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_450;
  TestStatus *local_438;
  VkQueue local_430;
  long local_428;
  code *local_420;
  Buffer local_418;
  VkDeviceSize vertexBufferOffset;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  VkDescriptorPool VStack_3d0;
  Handle<(vk::HandleType)14> local_3c0;
  pointer local_3b8;
  pointer local_3a8;
  ios_base local_370 [132];
  deUint32 local_2ec;
  bool local_2e8;
  VkPrimitiveTopology local_2e4;
  VkPipeline local_268;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_260;
  VkCommandPool local_248;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_240;
  VkFramebuffer local_228;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_220;
  VkDescriptorPool local_208;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_200;
  VkDescriptorBufferInfo resultBufferInfo;
  long *local_1c8 [2];
  long local_1b8 [2];
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_438 = __return_storage_ptr__;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  local_4f0 = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_430 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  deRandom_init(&rnd.m_rnd,0x7b);
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar14 = 0x20;
  do {
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,fVar16 * 62.0 + 1.0);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    vertexBufferOffset = CONCAT44(fVar16 * 62.0 + 1.0,(undefined4)vertexBufferOffset);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    uStack_3e0._0_4_ = fVar16 * 62.0 + 1.0;
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    uStack_3e0._4_4_ = fVar16 * 62.0 + 1.0;
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    local_3d8 = (pointer)CONCAT44(local_3d8._4_4_,fVar16 * 62.0 + 1.0);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    local_3d8 = (pointer)CONCAT44(fVar16 * 62.0 + 1.0,(float)local_3d8);
    if (tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
      _M_realloc_insert<vkt::tessellation::TessLevels_const&>
                ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                  *)&tessLevelCases,
                 (iterator)
                 tessLevelCases.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(TessLevels *)&vertexBufferOffset);
    }
    else {
      *(pointer *)
       ((tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->outer + 2) = local_3d8;
      *(VkDeviceSize *)
       (tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish)->inner = vertexBufferOffset;
      *(deUint64 *)
       (tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish)->outer = uStack_3e0;
      tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tessLevelCases.
           super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  iVar14 = 0;
  lVar15 = 8;
  do {
    iVar10 = referenceVertexCount
                       (caseDef.primitiveType,caseDef.spacingMode,caseDef.usePointMode,
                        (float *)((long)(tessLevelCases.
                                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->inner +
                                 lVar15 + -8),
                        (float *)((long)(tessLevelCases.
                                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->inner + lVar15)
                       );
    if (iVar14 <= iVar10) {
      iVar14 = iVar10;
    }
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x308);
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  makeBufferCreateInfo((VkBufferCreateInfo *)&vertexBufferOffset,(ulong)(stride * 6),0x80);
  vk = local_4f0;
  tessellation::Buffer::Buffer
            (&local_418,local_4f0,device,allocator,(VkBufferCreateInfo *)&vertexBufferOffset,
             (MemoryRequirement)0x1);
  bufferSize = (long)(iVar14 + 4) * 0x10 + 0x10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&vertexBufferOffset,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&local_4a8,vk,device,allocator,(VkBufferCreateInfo *)&vertexBufferOffset,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&vertexBufferOffset);
  this = ::vk::DescriptorSetLayoutBuilder::addBinding
                   ((DescriptorSetLayoutBuilder *)&vertexBufferOffset,
                    VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&rnd,this,vk,device,0);
  DStack_450.m_device = (VkDevice)local_198[0]._0_8_;
  DStack_450.m_allocator = (VkAllocationCallbacks *)local_198[0]._8_8_;
  local_458.m_internal._0_4_ = rnd.m_rnd.x;
  local_458.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_450.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_198[0]._M_allocated_capacity = (pointer)0x0;
  local_198[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_3b8 != (pointer)0x0) {
    operator_delete(local_3b8,(long)local_3a8 - (long)local_3b8);
  }
  if ((VkAllocationCallbacks *)VStack_3d0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_3d0.m_internal,local_3c0.m_internal - VStack_3d0.m_internal);
  }
  if (vertexBufferOffset != 0) {
    operator_delete((void *)vertexBufferOffset,(long)local_3d8 - vertexBufferOffset);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&rnd);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&vertexBufferOffset,this_00,vk,device,1,1);
  DStack_200.m_device = (VkDevice)local_3d8;
  DStack_200.m_allocator = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  local_208.m_internal = vertexBufferOffset;
  DStack_200.m_deviceIface = (DeviceInterface *)uStack_3e0;
  vertexBufferOffset = 0;
  uStack_3e0 = 0;
  local_3d8 = (pointer)0x0;
  VStack_3d0.m_internal = 0;
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,local_198[0]._M_allocated_capacity - rnd.m_rnd._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&vertexBufferOffset,vk,device,local_208
                    ,local_458);
  local_518 = local_3d8;
  pVStack_510 = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  local_528 = vertexBufferOffset;
  pWStack_520 = (pointer)uStack_3e0;
  resultBufferInfo.buffer.m_internal =
       local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&vertexBufferOffset);
  this_01 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&vertexBufferOffset,(int)local_528,(void *)0x0,
                       0);
  ::vk::DescriptorSetUpdateBuilder::update(this_01,vk,device);
  if (local_3b8 != (pointer)0x0) {
    operator_delete(local_3b8,(long)local_3a8 - (long)local_3b8);
  }
  if ((VkAllocationCallbacks *)VStack_3d0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_3d0.m_internal,local_3c0.m_internal - VStack_3d0.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&vertexBufferOffset);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset,vk,device);
  DStack_4e0.m_device = (VkDevice)local_3d8;
  DStack_4e0.m_allocator = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  local_4e8.m_internal = vertexBufferOffset;
  DStack_4e0.m_deviceIface = (DeviceInterface *)uStack_3e0;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,vk,device,
             (VkRenderPass)vertexBufferOffset);
  DStack_220.m_device = (VkDevice)local_3d8;
  DStack_220.m_allocator = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  local_228.m_internal = vertexBufferOffset;
  DStack_220.m_deviceIface = (DeviceInterface *)uStack_3e0;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexBufferOffset,vk,device,
                     local_458);
  DStack_470.m_device = (VkDevice)local_3d8;
  DStack_470.m_allocator = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  local_478.m_internal = vertexBufferOffset;
  DStack_470.m_deviceIface = (DeviceInterface *)uStack_3e0;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&vertexBufferOffset,vk,device,
                  queueFamilyIndex);
  DStack_240.m_device = (VkDevice)local_3d8;
  DStack_240.m_allocator = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  local_248.m_internal = vertexBufferOffset;
  DStack_240.m_deviceIface = (DeviceInterface *)uStack_3e0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&vertexBufferOffset,vk,device,
             (VkCommandPool)vertexBufferOffset,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  commandBuffer = vertexBufferOffset;
  local_508 = (pointer)uStack_3e0;
  local_500 = local_3d8;
  local_4f8 = (VkAllocationCallbacks *)VStack_3d0.m_internal;
  memset((GraphicsPipelineBuilder *)&vertexBufferOffset,0,0xfc);
  local_2e8 = false;
  local_2e4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_2ec = 6;
  pGVar11 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)&vertexBufferOffset,VK_FORMAT_R32_SFLOAT,stride);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"vert","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,&local_588);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar12._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  ppVVar1 = &vertices.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertices,"tesc","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)&vertices);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar12._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"tese","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,&local_4c8);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar12._M_node + 2),(VkSpecializationInfo *)0x0);
  pcVar13 = (code *)device;
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,pGVar11,vk,device,local_478,local_4e8);
  DStack_260.m_device = (VkDevice)local_198[0]._0_8_;
  DStack_260.m_allocator = (VkAllocationCallbacks *)local_198[0]._8_8_;
  local_268.m_internal._0_4_ = rnd.m_rnd.x;
  local_268.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_260.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_198[0]._M_allocated_capacity = (pointer)0x0;
  local_198[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if (vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar1) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(vertices.
                                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&vertexBufferOffset);
  lVar15 = 0;
  do {
    primitiveType = (TessPrimitiveType)pcVar13;
    vertexBufferOffset = (VkDeviceSize)context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_3e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_3e0,"Testing with tessellation levels: ",0x22);
    local_428 = lVar15;
    getTessellationLevelsString_abi_cxx11_
              ((string *)&rnd,
               (tessellation *)
               (tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar15),
               (TessLevels *)(ulong)caseDef.primitiveType,primitiveType);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_3e0,(char *)rnd.m_rnd._0_8_,rnd.m_rnd._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != local_198) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_3e0);
    std::ios_base::~ios_base(local_370);
    puVar3 = (undefined8 *)
             (local_418.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar3[2] = *(undefined8 *)
                 (tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar15].outer + 2);
    uVar6 = *(undefined8 *)
             tessLevelCases.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar15].outer;
    *puVar3 = *(undefined8 *)
               tessLevelCases.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar15].inner;
    puVar3[1] = uVar6;
    ::vk::flushMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((local_418.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (local_418.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
    pAVar7 = local_4a8.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    memset((local_4a8.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr,0,bufferSize);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar7->m_memory).m_internal,pAVar7->m_offset,bufferSize);
    beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
    beginRenderPassWithRasterizationDisabled(vk,(VkCommandBuffer)commandBuffer,local_4e8,local_228);
    (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,local_268.m_internal);
    (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,0,local_478.m_internal,0,1,&local_528,0,0);
    vertexBufferOffset = 0;
    (*vk->_vptr_DeviceInterface[0x58])(vk,commandBuffer,0,1,&local_418,&vertexBufferOffset);
    (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,6,1,0,0);
    endRenderPass(vk,(VkCommandBuffer)commandBuffer);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&vertexBufferOffset,0x40,0x2000,
               (VkBuffer)
               local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,bufferSize);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,commandBuffer,0x8000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&vertexBufferOffset,0
               ,0);
    endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
    submitCommandsAndWait(vk,device,local_430,(VkCommandBuffer)commandBuffer);
    pAVar7 = local_4a8.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    ::vk::invalidateMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((local_4a8.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (local_4a8.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,bufferSize);
    piVar4 = (int *)pAVar7->m_hostPtr;
    iVar14 = *piVar4;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              (&vertices,(long)iVar14,(allocator_type *)&rnd);
    if (0 < iVar14) {
      lVar15 = 0;
      do {
        *(int *)((long)(vertices.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15 + 8) = piVar4[6]
        ;
        *(undefined8 *)
         ((long)(vertices.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar15) =
             *(undefined8 *)(piVar4 + 4);
        lVar15 = lVar15 + 0xc;
        piVar4 = piVar4 + 4;
      } while ((long)iVar14 * 0xc != lVar15);
    }
    local_420 = (code *)0x0;
    pcVar13 = compareOneMinusTessCoord;
    if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD) {
      local_420 = compareOneMinusTessCoord;
    }
    if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE) {
      local_420 = compareTessCoordRange;
    }
    if (vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar5 = context->m_testCtx->m_log;
      vec = vertices.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
      do {
        lVar15 = 0;
        do {
          cVar9 = (*local_420)(vec->m_data[lVar15],pTVar5);
          if (cVar9 == '\0') {
            vertexBufferOffset = (VkDeviceSize)pTVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_3e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_3e0,"Note: got a wrong tessellation coordinate ",0x2a);
            if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
              tcu::operator<<((ostream *)&rnd,vec);
              std::__cxx11::stringbuf::str();
            }
            else {
              local_4c8._M_dataplus._M_p = *(pointer *)vec->m_data;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
              tcu::operator<<((ostream *)&rnd,(Vector<float,_2> *)&local_4c8);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
            std::ios_base::~ios_base(local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_3e0,local_588._M_dataplus._M_p,local_588._M_string_length)
            ;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&vertexBufferOffset,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_3e0);
            std::ios_base::~ios_base(local_370);
            vertexBufferOffset = (VkDeviceSize)&local_3d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&vertexBufferOffset,"Invalid tessellation coordinate component","")
            ;
            local_1c8[0] = local_1b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,vertexBufferOffset,uStack_3e0 + vertexBufferOffset);
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
            if ((undefined8 *)vertexBufferOffset != &local_3d8) {
              operator_delete((void *)vertexBufferOffset,
                              (ulong)((long)&(local_3d8->imageInfos).
                                             super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
            }
          }
          lVar15 = lVar15 + 1;
        } while ((ulong)(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) + 2 != lVar15);
        vec = vec + 1;
      } while (vec != vertices.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar15 = local_428;
    if (vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vertices.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar15 = lVar15 + 1;
    vk = local_4f0;
  } while (lVar15 != 0x20);
  vertexBufferOffset = (VkDeviceSize)&local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"OK","");
  pTVar8 = local_438;
  local_438->m_code = QP_TEST_RESULT_PASS;
  (local_438->m_description)._M_dataplus._M_p = (pointer)&(local_438->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438->m_description,vertexBufferOffset,uStack_3e0 + vertexBufferOffset)
  ;
  if ((undefined8 *)vertexBufferOffset != &local_3d8) {
    operator_delete((void *)vertexBufferOffset,
                    (ulong)((long)&(local_3d8->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_260,local_268);
  }
  if (commandBuffer != 0) {
    vertexBufferOffset = commandBuffer;
    (*(code *)(local_508->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (local_508,local_500,local_4f8,1);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_240,local_248);
  }
  if (local_478.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_470,local_478);
  }
  if (local_228.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_220,local_228);
  }
  if (local_4e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_4e0,local_4e8);
  }
  if (local_528 != 0) {
    vertexBufferOffset = local_528;
    (*(code *)(pWStack_520->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_520,local_518,pVStack_510,1);
  }
  if (local_208.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_200,local_208);
  }
  if (local_458.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_450,local_458);
  }
  if (local_4a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_4a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_4a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_418.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_418.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_418.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_418.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_418.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_418.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar8;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const int						numTessLevelCases	= 32;
	const std::vector<TessLevels>	tessLevelCases		= genTessLevelCases(numTessLevelCases);

	int maxNumVerticesInDrawCall = 0;
	for (int i = 0; i < numTessLevelCases; ++i)
		maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode,
										   &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]));

	// We may get more invocations than expected, so add some more space (arbitrary number).
	maxNumVerticesInDrawCall += 4;

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat		vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32		vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize	vertexDataSizeBytes = NUM_TESS_LEVELS * vertexStride;
	const Buffer		vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(vertexDataSizeBytes == sizeof(TessLevels));

	// Output buffer: number of invocations and array of tess coords

	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + maxNumVerticesInDrawCall * sizeof(tcu::Vec4);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; ++tessLevelCaseNdx)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Testing with tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], caseDef.primitiveType)
			<< tcu::TestLog::EndMessage;

		{
			const Allocation& alloc = vertexBuffer.getAllocation();
			deMemcpy(alloc.getHostPtr(), &tessLevelCases[tessLevelCaseNdx], sizeof(TessLevels));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, NUM_TESS_LEVELS, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify case result
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32				 numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3> vertices    = readInterleavedData<tcu::Vec3>(numVertices, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));

			// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
			DE_ASSERT(numVertices <= maxNumVerticesInDrawCall);

			tcu::TestLog& log           = context.getTestContext().getLog();
			const int     numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			CompareFunc compare = (caseDef.caseType == CASETYPE_TESS_COORD_RANGE     ? compareTessCoordRange :
								   caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD ? compareOneMinusTessCoord : DE_NULL);

			DE_ASSERT(compare != DE_NULL);

			for (std::vector<tcu::Vec3>::const_iterator vertexIter = vertices.begin(); vertexIter != vertices.end(); ++vertexIter)
			for (int i = 0; i < numComponents; ++i)
				if (!compare(log, (*vertexIter)[i]))
				{
						log << tcu::TestLog::Message << "Note: got a wrong tessellation coordinate "
							<< (numComponents == 3 ? de::toString(*vertexIter) : de::toString(vertexIter->swizzle(0,1))) << tcu::TestLog::EndMessage;

						tcu::TestStatus::fail("Invalid tessellation coordinate component");
				}
		}
	}
	return tcu::TestStatus::pass("OK");
}